

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tempseat.c
# Opt level: O0

Seat * tempseat_new(Seat *realseat)

{
  undefined8 *__s;
  TempSeat *ts;
  Seat *realseat_local;
  
  __s = (undefined8 *)safemalloc(1,0x58,0);
  memset(__s,0,0x58);
  __s[10] = &tempseat_vt;
  *__s = realseat;
  bufchain_init((bufchain *)(__s + 1));
  __s[7] = 0;
  __s[6] = 0;
  return (Seat *)(__s + 10);
}

Assistant:

Seat *tempseat_new(Seat *realseat)
{
    TempSeat *ts = snew(TempSeat);
    memset(ts, 0, sizeof(*ts));
    ts->seat.vt = &tempseat_vt;

    ts->realseat = realseat;
    bufchain_init(&ts->output);
    ts->outchunk_head = ts->outchunk_tail = NULL;

    return &ts->seat;
}